

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O2

void __thiscall
fizplex::BaseTestSingular_InvertIsFalse_Test::TestBody(BaseTestSingular_InvertIsFalse_Test *this)

{
  bool bVar1;
  long lVar2;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector> colList;
  Base b;
  Nonzero local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ColMatrix m;
  Nonzero local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Nonzero local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_b8 = 2;
  uStack_b0 = 0x3ff0000000000000;
  local_c8 = 1;
  uStack_c0 = 0x3ff0000000000000;
  local_d8.index = 0;
  local_d8.value = 1.0;
  l._M_len = 3;
  l._M_array = &local_d8;
  SVector::SVector((SVector *)&b,l);
  local_28 = 2;
  uStack_20 = 0x3ff0000000000000;
  local_38 = 1;
  uStack_30 = 0x3ff0000000000000;
  local_48.index = 0;
  local_48.value = 1.0;
  l_00._M_len = 3;
  l_00._M_array = &local_48;
  SVector::SVector((SVector *)&b.work,l_00);
  local_58 = 2;
  uStack_50 = 0x3ff0000000000000;
  local_68 = 1;
  uStack_60 = 0x3ff0000000000000;
  local_78.index = 0;
  local_78.value = 1.0;
  l_01._M_len = 3;
  l_01._M_array = &local_78;
  SVector::SVector((SVector *)&b.m,l_01);
  colList._M_len = 3;
  colList._M_array = (iterator)&b;
  ColMatrix::ColMatrix(&m,3,3,colList);
  lVar2 = 0x30;
  do {
    std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
    ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                   *)((long)&b.etms.
                             super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    Base::Base(&b,&m);
    Base::~Base(&b);
  }
  testing::Message::Message((Message *)&b);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
             ,0xc,
             "Expected: Base b(m) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&b);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&b);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&m.cols);
  return;
}

Assistant:

TEST(BaseTestSingular, InvertIsFalse) {
  const ColMatrix m(3, 3,
                    {{{0, 1}, {1, 1}, {2, 1}},
                     {{0, 1}, {1, 1}, {2, 1}},
                     {{0, 1}, {1, 1}, {2, 1}}});
  EXPECT_THROW(Base b(m), std::invalid_argument);
}